

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O0

PromiseFulfillerPair<kj::(anonymous_namespace)::ConcurrencyLimitingHttpClient::ConnectionCounter> *
kj::
newPromiseAndFulfiller<kj::(anonymous_namespace)::ConcurrencyLimitingHttpClient::ConnectionCounter>
          (SourceLocation location)

{
  SourceLocation location_00;
  RefOrVoid<kj::_::WeakFulfiller<kj::(anonymous_namespace)::ConcurrencyLimitingHttpClient::ConnectionCounter>_>
  params;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *node;
  ConnectionCounter *pCVar1;
  OwnPromiseNode *node_00;
  Promise<kj::(anonymous_namespace)::ConcurrencyLimitingHttpClient::ConnectionCounter> *pPVar2;
  Own<kj::_::WeakFulfiller<kj::(anonymous_namespace)::ConcurrencyLimitingHttpClient::ConnectionCounter>,_std::nullptr_t>
  *other;
  PromiseFulfillerPair<kj::(anonymous_namespace)::ConcurrencyLimitingHttpClient::ConnectionCounter>
  *in_RDI;
  undefined8 in_stack_00000008;
  void *local_50;
  Promise<kj::(anonymous_namespace)::ConcurrencyLimitingHttpClient::ConnectionCounter> promise;
  Own<kj::_::AdapterPromiseNode<kj::(anonymous_namespace)::ConcurrencyLimitingHttpClient::ConnectionCounter,_kj::_::PromiseAndFulfillerAdapter<kj::(anonymous_namespace)::ConcurrencyLimitingHttpClient::ConnectionCounter>_>,_kj::_::PromiseDisposer>
  local_30;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> local_28;
  OwnPromiseNode intermediate;
  Own<kj::_::WeakFulfiller<kj::(anonymous_namespace)::ConcurrencyLimitingHttpClient::ConnectionCounter>,_std::nullptr_t>
  wrapper;
  
  _::WeakFulfiller<kj::(anonymous_namespace)::ConcurrencyLimitingHttpClient::ConnectionCounter>::
  make();
  params = Own<kj::_::WeakFulfiller<kj::(anonymous_namespace)::ConcurrencyLimitingHttpClient::ConnectionCounter>,_std::nullptr_t>
           ::operator*((Own<kj::_::WeakFulfiller<kj::(anonymous_namespace)::ConcurrencyLimitingHttpClient::ConnectionCounter>,_std::nullptr_t>
                        *)&intermediate);
  _::
  allocPromise<kj::_::AdapterPromiseNode<kj::(anonymous_namespace)::ConcurrencyLimitingHttpClient::ConnectionCounter,kj::_::PromiseAndFulfillerAdapter<kj::(anonymous_namespace)::ConcurrencyLimitingHttpClient::ConnectionCounter>>,kj::_::WeakFulfiller<kj::(anonymous_namespace)::ConcurrencyLimitingHttpClient::ConnectionCounter>&>
            ((_ *)&local_30,params);
  Own<kj::_::PromiseNode,kj::_::PromiseDisposer>::
  Own<kj::_::AdapterPromiseNode<kj::(anonymous_namespace)::ConcurrencyLimitingHttpClient::ConnectionCounter,kj::_::PromiseAndFulfillerAdapter<kj::(anonymous_namespace)::ConcurrencyLimitingHttpClient::ConnectionCounter>>,void>
            ((Own<kj::_::PromiseNode,kj::_::PromiseDisposer> *)&local_28,&local_30);
  Own<kj::_::AdapterPromiseNode<kj::(anonymous_namespace)::ConcurrencyLimitingHttpClient::ConnectionCounter,_kj::_::PromiseAndFulfillerAdapter<kj::(anonymous_namespace)::ConcurrencyLimitingHttpClient::ConnectionCounter>_>,_kj::_::PromiseDisposer>
  ::~Own(&local_30);
  node = mv<kj::Own<kj::_::PromiseNode,kj::_::PromiseDisposer>>(&local_28);
  local_50 = (void *)0x0;
  pCVar1 = implicitCast<kj::(anonymous_namespace)::ConcurrencyLimitingHttpClient::ConnectionCounter*,decltype(nullptr)>
                     (&local_50);
  unique0x10000217 = location;
  location_00.fileName = (char *)in_stack_00000008;
  location_00._16_8_ = location.function;
  node_00 = _::
            maybeChain<kj::(anonymous_namespace)::ConcurrencyLimitingHttpClient::ConnectionCounter>
                      (node,pCVar1,location_00);
  _::PromiseNode::
  to<kj::Promise<kj::(anonymous_namespace)::ConcurrencyLimitingHttpClient::ConnectionCounter>>
            ((PromiseNode *)&stack0xffffffffffffffb8,node_00);
  pPVar2 = mv<kj::Promise<kj::(anonymous_namespace)::ConcurrencyLimitingHttpClient::ConnectionCounter>>
                     ((Promise<kj::(anonymous_namespace)::ConcurrencyLimitingHttpClient::ConnectionCounter>
                       *)&stack0xffffffffffffffb8);
  Promise<kj::(anonymous_namespace)::ConcurrencyLimitingHttpClient::ConnectionCounter>::Promise
            (&in_RDI->promise,pPVar2);
  other = mv<kj::Own<kj::_::WeakFulfiller<kj::(anonymous_namespace)::ConcurrencyLimitingHttpClient::ConnectionCounter>,decltype(nullptr)>>
                    ((Own<kj::_::WeakFulfiller<kj::(anonymous_namespace)::ConcurrencyLimitingHttpClient::ConnectionCounter>,_std::nullptr_t>
                      *)&intermediate);
  Own<kj::PromiseFulfiller<kj::(anonymous_namespace)::ConcurrencyLimitingHttpClient::ConnectionCounter>,decltype(nullptr)>
  ::
  Own<kj::_::WeakFulfiller<kj::(anonymous_namespace)::ConcurrencyLimitingHttpClient::ConnectionCounter>,void>
            ((Own<kj::PromiseFulfiller<kj::(anonymous_namespace)::ConcurrencyLimitingHttpClient::ConnectionCounter>,decltype(nullptr)>
              *)&in_RDI->fulfiller,other);
  Promise<kj::(anonymous_namespace)::ConcurrencyLimitingHttpClient::ConnectionCounter>::~Promise
            ((Promise<kj::(anonymous_namespace)::ConcurrencyLimitingHttpClient::ConnectionCounter> *
             )&stack0xffffffffffffffb8);
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::~Own(&local_28);
  Own<kj::_::WeakFulfiller<kj::(anonymous_namespace)::ConcurrencyLimitingHttpClient::ConnectionCounter>,_std::nullptr_t>
  ::~Own((Own<kj::_::WeakFulfiller<kj::(anonymous_namespace)::ConcurrencyLimitingHttpClient::ConnectionCounter>,_std::nullptr_t>
          *)&intermediate);
  return in_RDI;
}

Assistant:

PromiseFulfillerPair<T> newPromiseAndFulfiller(SourceLocation location) {
  auto wrapper = _::WeakFulfiller<T>::make();

  _::OwnPromiseNode intermediate(
      _::allocPromise<_::AdapterPromiseNode<
          _::FixVoid<T>, _::PromiseAndFulfillerAdapter<T>>>(*wrapper));
  auto promise = _::PromiseNode::to<_::ReducePromises<T>>(
      _::maybeChain(kj::mv(intermediate), implicitCast<T*>(nullptr), location));

  return PromiseFulfillerPair<T> { kj::mv(promise), kj::mv(wrapper) };
}